

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothubtransporthttp.c
# Opt level: O0

IOTHUB_CLIENT_RESULT
IoTHubTransportHttp_SetOption(TRANSPORT_LL_HANDLE handle,char *option,void *value)

{
  int iVar1;
  HTTPAPIEX_RESULT HVar2;
  LOGGER_LOG p_Var3;
  LOGGER_LOG l_2;
  LOGGER_LOG l_1;
  HTTPAPIEX_RESULT HTTPAPIEX_result;
  HTTPTRANSPORT_HANDLE_DATA *handleData;
  LOGGER_LOG l;
  IOTHUB_CLIENT_RESULT result;
  void *value_local;
  char *option_local;
  TRANSPORT_LL_HANDLE handle_local;
  
  if (((handle == (TRANSPORT_LL_HANDLE)0x0) || (option == (char *)0x0)) || (value == (void *)0x0)) {
    l._4_4_ = IOTHUB_CLIENT_INVALID_ARG;
    p_Var3 = xlogging_get_log_function();
    if (p_Var3 != (LOGGER_LOG)0x0) {
      (*p_Var3)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransporthttp.c"
                ,"IoTHubTransportHttp_SetOption",0x873,1,
                "invalid parameter (NULL) passed to IoTHubTransportHttp_SetOption");
    }
  }
  else {
    iVar1 = strcmp(OPTION_BATCHING,option);
    if (iVar1 == 0) {
      *(byte *)((long)handle + 0x10) = *value & 1;
      l._4_4_ = IOTHUB_CLIENT_OK;
    }
    else {
      iVar1 = strcmp(OPTION_MIN_POLLING_TIME,option);
      if (iVar1 == 0) {
        *(undefined4 *)((long)handle + 0x14) = *value;
        l._4_4_ = IOTHUB_CLIENT_OK;
      }
      else {
        HVar2 = HTTPAPIEX_SetOption(*(HTTPAPIEX_HANDLE *)((long)handle + 8),option,value);
        if (HVar2 == HTTPAPIEX_OK) {
          l._4_4_ = IOTHUB_CLIENT_OK;
        }
        else if (HVar2 == HTTPAPIEX_INVALID_ARG) {
          l._4_4_ = IOTHUB_CLIENT_INVALID_ARG;
          p_Var3 = xlogging_get_log_function();
          if (p_Var3 != (LOGGER_LOG)0x0) {
            (*p_Var3)(AZ_LOG_ERROR,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransporthttp.c"
                      ,"IoTHubTransportHttp_SetOption",0x88c,1,"HTTPAPIEX_SetOption failed");
          }
        }
        else {
          l._4_4_ = IOTHUB_CLIENT_ERROR;
          p_Var3 = xlogging_get_log_function();
          if (p_Var3 != (LOGGER_LOG)0x0) {
            (*p_Var3)(AZ_LOG_ERROR,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransporthttp.c"
                      ,"IoTHubTransportHttp_SetOption",0x891,1,"HTTPAPIEX_SetOption failed");
          }
        }
      }
    }
  }
  return l._4_4_;
}

Assistant:

static IOTHUB_CLIENT_RESULT IoTHubTransportHttp_SetOption(TRANSPORT_LL_HANDLE handle, const char* option, const void* value)
{
    IOTHUB_CLIENT_RESULT result;
    if (
        (handle == NULL) ||
        (option == NULL) ||
        (value == NULL)
        )
    {
        result = IOTHUB_CLIENT_INVALID_ARG;
        LogError("invalid parameter (NULL) passed to IoTHubTransportHttp_SetOption");
    }
    else
    {
        HTTPTRANSPORT_HANDLE_DATA* handleData = (HTTPTRANSPORT_HANDLE_DATA*)handle;
        if (strcmp(OPTION_BATCHING, option) == 0)
        {
            handleData->doBatchedTransfers = *(bool*)value;
            result = IOTHUB_CLIENT_OK;
        }
        else if (strcmp(OPTION_MIN_POLLING_TIME, option) == 0)
        {
            handleData->getMinimumPollingTime = *(unsigned int*)value;
            result = IOTHUB_CLIENT_OK;
        }
        else
        {
            HTTPAPIEX_RESULT HTTPAPIEX_result = HTTPAPIEX_SetOption(handleData->httpApiExHandle, option, value);
            if (HTTPAPIEX_result == HTTPAPIEX_OK)
            {
                result = IOTHUB_CLIENT_OK;
            }
            else if (HTTPAPIEX_result == HTTPAPIEX_INVALID_ARG)
            {
                result = IOTHUB_CLIENT_INVALID_ARG;
                LogError("HTTPAPIEX_SetOption failed");
            }
            else
            {
                result = IOTHUB_CLIENT_ERROR;
                LogError("HTTPAPIEX_SetOption failed");
            }
        }
    }
    return result;
}